

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManComputeOverlap2One_rec(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if ((iObj < 0) || (vLabel->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  iVar3 = 0;
  if (vLabel->pArray[(uint)iObj] == '\0') {
    vLabel->pArray[(uint)iObj] = '\x01';
    if (p->nObjs <= iObj) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    uVar2 = (uint)*(undefined8 *)(pGVar1 + (uint)iObj);
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x133,
                    "int Gia_ManComputeOverlap2One_rec(Gia_Man_t *, int, Vec_Str_t *, Vec_Int_t *)")
      ;
    }
    iVar3 = Gia_ManComputeOverlap2One_rec(p,iObj - (uVar2 & 0x1fffffff),vLabel,vVisit);
    iVar4 = Gia_ManComputeOverlap2One_rec
                      (p,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff),vLabel,vVisit)
    ;
    Vec_IntPush(vVisit,iObj);
    iVar3 = iVar3 + iVar4 + 1;
  }
  return iVar3;
}

Assistant:

int Gia_ManComputeOverlap2One_rec( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int Counter;
    if ( Vec_StrEntry(vLabel, iObj) )
        return 0;
    Vec_StrWriteEntry( vLabel, iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsAnd(pObj) );
    Counter  = Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId0(pObj, iObj), vLabel, vVisit );
    Counter += Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId1(pObj, iObj), vLabel, vVisit );
    Vec_IntPush( vVisit, iObj );
    return Counter + 1;
}